

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_19dfa::ClCommandLine::parse_command_line_options
          (ClCommandLine *this,string_stream *output,string_stream *errors)

{
  bool bVar1;
  allocator local_51;
  string local_50;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  string_stream *local_20;
  string_stream *errors_local;
  string_stream *output_local;
  ClCommandLine *this_local;
  
  local_20 = errors;
  errors_local = output;
  output_local = (string_stream *)this;
  local_28._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 (&this->strings_);
  local_30._M_node =
       (_List_node_base *)
       std::end<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 (&this->strings_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"overview",&local_51);
  bVar1 = pstore::command_line::details::
          parse_command_line_options<std::_List_iterator<std::__cxx11::string>,std::__cxx11::ostringstream,std::__cxx11::ostringstream>
                    (local_28,local_30,&local_50,errors_local,local_20);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return bVar1;
}

Assistant:

bool parse_command_line_options (string_stream & output, string_stream & errors) {
            return details::parse_command_line_options (std::begin (strings_), std::end (strings_),
                                                        "overview", output, errors);
        }